

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

void __thiscall SQVM::Finalize(SQVM *this)

{
  SQUnsignedInteger SVar1;
  SQObjectPtr *this_00;
  SQUnsignedInteger local_78;
  SQInteger i;
  SQInteger size;
  CallInfo local_58;
  SQVM *local_10;
  SQVM *this_local;
  
  local_10 = this;
  if (this->_releasehook != (SQRELEASEHOOK)0x0) {
    (*this->_releasehook)(this->_foreignptr,0);
    this->_releasehook = (SQRELEASEHOOK)0x0;
  }
  if (this->_openouters != (SQOuter *)0x0) {
    CloseOuters(this,(this->_stack)._vals);
  }
  ::SQObjectPtr::Null(&this->_roottable);
  ::SQObjectPtr::Null(&this->_lasterror);
  ::SQObjectPtr::Null(&this->_errorhandler);
  this->_debughook = false;
  this->_debughook_native = (SQDEBUGHOOK)0x0;
  ::SQObjectPtr::Null(&this->_debughook_closure);
  ::SQObjectPtr::Null(&this->temp_reg);
  local_58._prevtop = 0;
  local_58._target = 0;
  local_58._ncalls = 0;
  local_58._60_4_ = 0;
  local_58._generator = (SQGenerator *)0x0;
  local_58._etraps = 0;
  local_58._prevstkbase = 0;
  local_58._closure.super_SQObject._type = 0;
  local_58._closure.super_SQObject._4_4_ = 0;
  local_58._closure.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_58._ip = (SQInstruction *)0x0;
  local_58._literals = (SQObjectPtr *)0x0;
  local_58._root = 0;
  CallInfo::CallInfo(&local_58);
  sqvector<SQVM::CallInfo>::resize(&this->_callstackdata,0,&local_58);
  CallInfo::~CallInfo(&local_58);
  SVar1 = sqvector<SQObjectPtr>::size(&this->_stack);
  for (local_78 = 0; (long)local_78 < (long)SVar1; local_78 = local_78 + 1) {
    this_00 = sqvector<SQObjectPtr>::operator[](&this->_stack,local_78);
    ::SQObjectPtr::Null(this_00);
  }
  return;
}

Assistant:

void SQVM::Finalize()
{
    if(_releasehook) { _releasehook(_foreignptr,0); _releasehook = NULL; }
    if(_openouters) CloseOuters(&_stack._vals[0]);
    _roottable.Null();
    _lasterror.Null();
    _errorhandler.Null();
    _debughook = false;
    _debughook_native = NULL;
    _debughook_closure.Null();
    temp_reg.Null();
    _callstackdata.resize(0);
    SQInteger size=_stack.size();
    for(SQInteger i=0;i<size;i++)
        _stack[i].Null();
}